

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void * __thiscall google::protobuf::Arena::SlowAlloc(Arena *this,size_t n)

{
  ThreadCache *me_00;
  Block *pBVar1;
  Block *b;
  void *me;
  size_t n_local;
  Arena *this_local;
  
  me_00 = thread_cache();
  pBVar1 = FindBlock(this,me_00);
  if ((pBVar1 == (Block *)0x0) || (pBVar1->size - pBVar1->pos < n)) {
    pBVar1 = NewBlock(this,me_00,pBVar1,n,*(size_t *)(this + 0x40),*(size_t *)(this + 0x48));
    AddBlock(this,pBVar1);
    SetThreadCacheBlock(this,pBVar1);
    this_local = (Arena *)(pBVar1 + 1);
  }
  else {
    SetThreadCacheBlock(this,pBVar1);
    internal::NoBarrier_Store((Atomic64 *)(this + 0x10),(Atomic64)pBVar1);
    this_local = (Arena *)AllocFromBlock(pBVar1,n);
  }
  return this_local;
}

Assistant:

void* Arena::SlowAlloc(size_t n) {
  void* me = &thread_cache();
  Block* b = FindBlock(me);  // Find block owned by me.
  // See if allocation fits in my latest block.
  if (b != NULL && b->avail() >= n) {
    SetThreadCacheBlock(b);
    google::protobuf::internal::NoBarrier_Store(&hint_, reinterpret_cast<google::protobuf::internal::AtomicWord>(b));
    return AllocFromBlock(b, n);
  }
  b = NewBlock(me, b, n, options_.start_block_size, options_.max_block_size);
  AddBlock(b);
  SetThreadCacheBlock(b);
  return reinterpret_cast<char*>(b) + kHeaderSize;
}